

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig(LaunchHelper *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  string srcdir;
  string fname;
  cmGeneratedFileStream fout;
  allocator<char> local_2d9;
  string local_2d8;
  string local_2b8;
  string local_298;
  cmGeneratedFileStream local_278;
  
  WriteScrapeMatchers(this,"Warning",&this->Handler->ReallyCustomWarningMatches);
  WriteScrapeMatchers(this,"WarningSuppress",&this->Handler->ReallyCustomWarningExceptions);
  cmStrCat<std::__cxx11::string&,char_const(&)[25]>
            (&local_298,&this->Handler->CTestLaunchDir,(char (*) [25])"/CTestLaunchConfig.cmake");
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278,&local_298,false,None);
  this_00 = this->CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"SourceDirectory",&local_2d9);
  cmCTest::GetCTestConfiguration(&local_2b8,this_00,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  poVar1 = std::operator<<((ostream *)&local_278,"set(CTEST_SOURCE_DIRECTORY \"");
  poVar1 = std::operator<<(poVar1,(string *)&local_2b8);
  std::operator<<(poVar1,"\")\n");
  std::__cxx11::string::~string((string *)&local_2b8);
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  return;
}

Assistant:

void cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig()
{
  this->WriteScrapeMatchers("Warning",
                            this->Handler->ReallyCustomWarningMatches);
  this->WriteScrapeMatchers("WarningSuppress",
                            this->Handler->ReallyCustomWarningExceptions);

  // Give some testing configuration information to the launcher.
  std::string fname =
    cmStrCat(this->Handler->CTestLaunchDir, "/CTestLaunchConfig.cmake");
  cmGeneratedFileStream fout(fname);
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  fout << "set(CTEST_SOURCE_DIRECTORY \"" << srcdir << "\")\n";
}